

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_int>::merge_sub_subarrays(Suffix_Array<unsigned_int> *this)

{
  ostream *poVar1;
  anon_class_1_0_00000001 *in_RDI;
  rep_conflict rVar2;
  time_point t_e;
  anon_class_16_2_552ac3a7 sort_part;
  atomic_uint64_t solved_;
  anon_class_8_1_8991fb9c dup;
  time_point t_s;
  nanoseconds *in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb8;
  anon_class_16_2_552ac3a7 *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  undefined1 local_20 [16];
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::system_clock::now();
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_int>::merge_sub_subarrays()::_lambda(unsigned_int)_1_const&>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             SUB81((ulong)in_RDI >> 0x38,0));
  memset(local_20,0,8);
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_int>::merge_sub_subarrays()::_lambda(unsigned_int)_2_const&>
            ((size_t)in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,SUB81((ulong)in_RDI >> 0x38,0));
  std::operator<<((ostream *)&std::cerr,"\n");
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Merged the sorted subarrays in each partition. Time taken: ");
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)poVar1,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_RDI);
  rVar2 = anon_class_1_0_00000001::operator()(in_RDI,in_stack_ffffffffffffffa8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::merge_sub_subarrays()
{
    const auto t_s = now();

    const auto dup =    // Duplicates the `j`'th partition.
        [&](const idx_t j)
        {
            const auto part_size = part_size_scan_[j + 1] - part_size_scan_[j];
            std::memcpy(SA_ + part_size_scan_[j], SA_w + part_size_scan_[j], part_size * sizeof(idx_t));
            std::memcpy(LCP_ + part_size_scan_[j], LCP_w + part_size_scan_[j], part_size * sizeof(idx_t));
        };

    parlay::parallel_for(0, p_, dup, 1);    // Fulfill `sort_partition`'s precondition.


    std::atomic_uint64_t solved_ = 0;   // Progress tracker—number of subproblems solved in some step.
    const auto sort_part =
        [&](const idx_t j)
        {
            const auto part_off = part_size_scan_[j];   // Offset of the partition in the partitions' flat collection.
            auto const X_j = SA_w + part_off;   // Memory-base for partition `j`.
            auto const Y_j = SA_ + part_off;    // Location to sort partition `j`.
            auto const LCP_X_j = LCP_w + part_off;  // Memory-base for the LCP-arrays of partition `j`.
            auto const LCP_Y_j = LCP_ + part_off;   // LCP array of `Y_j`.
            auto const sub_subarr_off = part_ruler_ + j * (p_ + 1); // Indices of the sorted subarrays in `X_i`.

            sort_partition(X_j, Y_j, p_, sub_subarr_off, LCP_X_j, LCP_Y_j);

            if(++solved_ % 8 == 0)
                std::cerr << "\rMerged " << solved_ << " partitions.";
        };

    parlay::parallel_for(0, p_, sort_part, 1);  // Merge the sorted subarrays in each partitions.
    std::cerr << "\n";

    const auto t_e = now();
    std::cerr << "Merged the sorted subarrays in each partition. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}